

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExecuteTest.h
# Opt level: O1

void UnitTest::
     ExecuteTest<UnitTest::(anonymous_namespace)::DeferredTestReporterFixtureReportFailureSavesFailureDetailsForMultipleFailuresHelper>
               (DeferredTestReporterFixtureReportFailureSavesFailureDetailsForMultipleFailuresHelper
                *testObject,TestDetails *details)

{
  TestDetails *details_00;
  pointer pDVar1;
  TestResults *pTVar2;
  pointer ppVar3;
  int iVar4;
  TestDetails **ppTVar5;
  DeferredTestResultList *pDVar6;
  TestResults **ppTVar7;
  undefined8 *puVar8;
  undefined8 uVar9;
  char *failure2;
  char *failure1;
  SignalTranslator sig;
  int local_4c8 [2];
  TestDetails local_4c0;
  char *local_4a0;
  char *local_498;
  SignalTranslator local_490;
  
  ppTVar5 = CurrentTest::Details();
  *ppTVar5 = details;
  SignalTranslator::SignalTranslator(&local_490);
  iVar4 = __sigsetjmp(SignalTranslator::s_jumpTarget,1);
  if (iVar4 == 0) {
    local_498 = "failure 1";
    local_4a0 = "failure 2";
    details_00 = &(testObject->super_DeferredTestReporterFixture).details;
    DeferredTestReporter::ReportTestStart((DeferredTestReporter *)testObject,details_00);
    DeferredTestReporter::ReportFailure((DeferredTestReporter *)testObject,details_00,local_498);
    DeferredTestReporter::ReportFailure((DeferredTestReporter *)testObject,details_00,local_4a0);
    pDVar6 = DeferredTestReporter::GetResults((DeferredTestReporter *)testObject);
    pDVar1 = (pDVar6->
             super__Vector_base<UnitTest::DeferredTestResult,_std::allocator<UnitTest::DeferredTestResult>_>
             )._M_impl.super__Vector_impl_data._M_start;
    if ((pDVar6->
        super__Vector_base<UnitTest::DeferredTestResult,_std::allocator<UnitTest::DeferredTestResult>_>
        )._M_impl.super__Vector_impl_data._M_finish == pDVar1) {
      uVar9 = std::__throw_out_of_range_fmt
                        ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)"
                         ,0);
      __cxa_begin_catch(uVar9);
      ppTVar7 = CurrentTest::Results();
      pTVar2 = *ppTVar7;
      ppTVar5 = CurrentTest::Details();
      TestDetails::TestDetails(&local_4c0,*ppTVar5,0x5f);
      TestResults::OnTestFailure
                (pTVar2,&local_4c0,
                 "Unhandled exception in CHECK_EQUAL(failure2, result.failures[1].second)");
      __cxa_end_catch();
    }
    else {
      ppTVar7 = CurrentTest::Results();
      pTVar2 = *ppTVar7;
      local_4c8[1] = 2;
      local_4c8[0] = (int)((ulong)((long)(pDVar1->failures).
                                         super__Vector_base<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                         ._M_impl.super__Vector_impl_data._M_finish -
                                  (long)(pDVar1->failures).
                                        super__Vector_base<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                        ._M_impl.super__Vector_impl_data._M_start) >> 3) *
                     -0x33333333;
      ppTVar5 = CurrentTest::Details();
      TestDetails::TestDetails(&local_4c0,*ppTVar5,0x5d);
      CheckEqual<int,int>(pTVar2,local_4c8 + 1,local_4c8,&local_4c0);
      ppTVar7 = CurrentTest::Results();
      pTVar2 = *ppTVar7;
      ppVar3 = (pDVar1->failures).
               super__Vector_base<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      ppTVar5 = CurrentTest::Details();
      TestDetails::TestDetails(&local_4c0,*ppTVar5,0x5e);
      CheckEqual<char_const*,std::__cxx11::string>(pTVar2,&local_498,&ppVar3->second,&local_4c0);
      ppTVar7 = CurrentTest::Results();
      pTVar2 = *ppTVar7;
      ppVar3 = (pDVar1->failures).
               super__Vector_base<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      ppTVar5 = CurrentTest::Details();
      TestDetails::TestDetails(&local_4c0,*ppTVar5,0x5f);
      CheckEqual<char_const*,std::__cxx11::string>(pTVar2,&local_4a0,&ppVar3[1].second,&local_4c0);
    }
    SignalTranslator::~SignalTranslator(&local_490);
    return;
  }
  puVar8 = (undefined8 *)__cxa_allocate_exception(8);
  *puVar8 = "Unhandled system exception";
  __cxa_throw(puVar8,&char_const*::typeinfo,0);
}

Assistant:

void ExecuteTest(T& testObject, TestDetails const& details)
{
	CurrentTest::Details() = &details;

	try
	{
#ifdef UNITTEST_POSIX
		UNITTEST_THROW_SIGNALS
#endif
		testObject.RunImpl();
	}
	catch (AssertException const& e)
	{
		CurrentTest::Results()->OnTestFailure(
			TestDetails(details.testName, details.suiteName, e.Filename(), e.LineNumber()), e.what());
	}
	catch (std::exception const& e)
	{
		MemoryOutStream stream;
		stream << "Unhandled exception: " << e.what();
		CurrentTest::Results()->OnTestFailure(details, stream.GetText());
	}
	catch (...)
	{
		CurrentTest::Results()->OnTestFailure(details, "Unhandled exception: Crash!");
	}
}